

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

void mreadmsg(monst *mtmp,obj *otmp)

{
  uint uVar1;
  short sVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *local_148;
  uint savebknown;
  short saverole;
  char onambuf [256];
  boolean vismon;
  obj *otmp_local;
  monst *mtmp_local;
  
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((bVar4 = false, ublindf == (obj *)0x0 || (bVar4 = false, ublindf->oartifact != '\x1d'))))
         || (((u.uprops[0x40].intrinsic == 0 &&
              ((u.uprops[0x40].extrinsic == 0 &&
               (bVar4 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
             (bVar4 = false, (mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_002651c6;
      bVar3 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x002650fb;
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
joined_r0x002650fb:
    bVar4 = false;
    if (bVar3 == 0) goto LAB_002651c6;
  }
  if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) ||
      (bVar4 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (bVar4 = false, (*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0)) {
    bVar4 = (*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
  }
LAB_002651c6:
  if ((bVar4) || (flags.soundok != '\0')) {
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffdf | 0x20;
    sVar2 = urole.malenum;
    uVar1 = *(uint *)&otmp->field_0x4a;
    if ((!bVar4) &&
       (*(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffbf, urole.malenum == 0x161
       )) {
      urole.malenum = 0;
    }
    pcVar6 = singular(otmp,doname);
    strcpy((char *)&savebknown,pcVar6);
    urole.malenum = sVar2;
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffbf | (uVar1 >> 6 & 1) << 6;
    if (bVar4) {
      pcVar6 = Monnam(mtmp);
      pline("%s reads %s!",pcVar6,&savebknown);
    }
    else {
      pcVar6 = x_monnam(mtmp,2,(char *)0x0,0xb,'\0');
      You_hear("%s reading %s.",pcVar6,&savebknown);
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) != 0) {
      if (bVar4) {
        local_148 = mon_nam(mtmp);
      }
      else {
        iVar5 = pronoun_gender(level,mtmp);
        local_148 = genders[iVar5].he;
      }
      pline("Being confused, %s mispronounces the magic words...",local_148);
    }
  }
  return;
}

Assistant:

static void mreadmsg(struct monst *mtmp, struct obj *otmp)
{
	boolean vismon = canseemon(level, mtmp);
	char onambuf[BUFSZ];
	short saverole;
	unsigned savebknown;

	if (!vismon && !flags.soundok)
	    return;		/* no feedback */

	otmp->dknown = 1;  /* seeing or hearing it read reveals its label */
	/* shouldn't be able to hear curse/bless status of unseen scrolls;
	   for priest characters, bknown will always be set during naming */
	savebknown = otmp->bknown;
	saverole = Role_switch;
	if (!vismon) {
	    otmp->bknown = 0;
	    if (Role_if (PM_PRIEST)) Role_switch = 0;
	}
	strcpy(onambuf, singular(otmp, doname));
	Role_switch = saverole;
	otmp->bknown = savebknown;

	if (vismon)
	    pline("%s reads %s!", Monnam(mtmp), onambuf);
	else
	    You_hear("%s reading %s.",
		x_monnam(mtmp, ARTICLE_A, NULL,
		    (SUPPRESS_IT|SUPPRESS_INVISIBLE|SUPPRESS_SADDLE), FALSE),
		onambuf);

	if (mtmp->mconf)
	    pline("Being confused, %s mispronounces the magic words...",
		  vismon ? mon_nam(mtmp) : mhe(level, mtmp));
}